

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

Block * __thiscall
moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::
FreeList<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::Block>::try_get
          (FreeList<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::Block> *this)

{
  bool bVar1;
  __atomic_base<unsigned_int> _Var2;
  __pointer_type next;
  __int_type_conflict1 refs;
  __pointer_type prevHead;
  __pointer_type head;
  memory_order __b;
  atomic<unsigned_int> *in_stack_fffffffffffffe90;
  memory_order __m;
  atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::Block_*> *in_stack_fffffffffffffe98;
  Block *in_stack_fffffffffffffeb8;
  FreeList<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::Block> *in_stack_fffffffffffffec0;
  memory_order in_stack_ffffffffffffff10;
  memory_order in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  atomic<unsigned_int> *paVar3;
  __atomic_base<unsigned_int> local_94;
  __pointer_type local_90;
  __pointer_type local_88;
  uint local_6c;
  memory_order local_68;
  int local_64;
  atomic<unsigned_int> *local_60;
  undefined1 local_51;
  __int_type_conflict1 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  __int_type_conflict1 local_44;
  __atomic_base<unsigned_int> *local_40;
  atomic<unsigned_int> *local_38;
  __int_type_conflict1 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  atomic<unsigned_int> *local_20;
  
  local_88 = std::atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::Block_*>::load
                       (in_stack_fffffffffffffe98,
                        (memory_order)((ulong)in_stack_fffffffffffffe90 >> 0x20));
LAB_0034aa81:
  do {
    if (local_88 == (__pointer_type)0x0) {
      return (Block *)0x0;
    }
    local_90 = local_88;
    paVar3 = &local_88->freeListRefs;
    local_64 = 0;
    local_60 = paVar3;
    local_68 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_64 - 1U < 2) {
      local_6c = (paVar3->super___atomic_base<unsigned_int>)._M_i;
    }
    else if (local_64 == 5) {
      local_6c = (paVar3->super___atomic_base<unsigned_int>)._M_i;
    }
    else {
      local_6c = (paVar3->super___atomic_base<unsigned_int>)._M_i;
    }
    local_94._M_i = local_6c;
    __m = (memory_order)((ulong)in_stack_fffffffffffffe90 >> 0x20);
    _Var2._M_i = local_94._M_i;
    if ((local_6c & 0x7fffffff) != 0) {
      paVar3 = &local_88->freeListRefs;
      local_50 = local_6c + 1;
      local_40 = &local_94;
      local_48 = 2;
      local_4c = 0;
      LOCK();
      _Var2._M_i = (paVar3->super___atomic_base<unsigned_int>)._M_i;
      local_51 = local_6c == _Var2._M_i;
      if ((bool)local_51) {
        (paVar3->super___atomic_base<unsigned_int>)._M_i = local_50;
        _Var2._M_i = local_6c;
      }
      UNLOCK();
      local_44 = local_50;
      local_38 = paVar3;
      if ((bool)local_51) {
        std::atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::Block_*>::load
                  (in_stack_fffffffffffffe98,__m);
        bVar1 = std::atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::Block_*>::
                compare_exchange_strong
                          ((atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::Block_*> *)
                           paVar3,(__pointer_type *)
                                  CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           (__pointer_type)
                           CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                           in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
        if (bVar1) {
          LOCK();
          (local_88->freeListRefs).super___atomic_base<unsigned_int>._M_i =
               (local_88->freeListRefs).super___atomic_base<unsigned_int>._M_i - 2;
          UNLOCK();
          return local_88;
        }
        in_stack_fffffffffffffe90 = &local_90->freeListRefs;
        local_24 = 1;
        local_28 = 4;
        local_2c = 1;
        in_stack_fffffffffffffe98 =
             (atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::Block_*> *)0x3;
        LOCK();
        local_94._M_i = (in_stack_fffffffffffffe90->super___atomic_base<unsigned_int>)._M_i;
        (in_stack_fffffffffffffe90->super___atomic_base<unsigned_int>)._M_i =
             (in_stack_fffffffffffffe90->super___atomic_base<unsigned_int>)._M_i - 1;
        UNLOCK();
        local_30 = local_94._M_i;
        local_20 = in_stack_fffffffffffffe90;
        if (local_94._M_i == 0x80000001) {
          add_knowing_refcount_is_zero(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        }
        goto LAB_0034aa81;
      }
    }
    local_94._M_i = _Var2._M_i;
    local_88 = std::atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::Block_*>::load
                         (in_stack_fffffffffffffe98,__m);
  } while( true );
}

Assistant:

inline N* try_get()
		{
#if MCDBGQ_NOLOCKFREE_FREELIST
			debug::DebugLock lock(mutex);
#endif		
			auto head = freeListHead.load(std::memory_order_acquire);
			while (head != nullptr) {
				auto prevHead = head;
				auto refs = head->freeListRefs.load(std::memory_order_relaxed);
				if ((refs & REFS_MASK) == 0 || !head->freeListRefs.compare_exchange_strong(refs, refs + 1, std::memory_order_acquire, std::memory_order_relaxed)) {
					head = freeListHead.load(std::memory_order_acquire);
					continue;
				}
				
				// Good, reference count has been incremented (it wasn't at zero), which means we can read the
				// next and not worry about it changing between now and the time we do the CAS
				auto next = head->freeListNext.load(std::memory_order_relaxed);
				if (freeListHead.compare_exchange_strong(head, next, std::memory_order_acquire, std::memory_order_relaxed)) {
					// Yay, got the node. This means it was on the list, which means shouldBeOnFreeList must be false no
					// matter the refcount (because nobody else knows it's been taken off yet, it can't have been put back on).
					assert((head->freeListRefs.load(std::memory_order_relaxed) & SHOULD_BE_ON_FREELIST) == 0);
					
					// Decrease refcount twice, once for our ref, and once for the list's ref
					head->freeListRefs.fetch_sub(2, std::memory_order_release);
					return head;
				}
				
				// OK, the head must have changed on us, but we still need to decrease the refcount we increased.
				// Note that we don't need to release any memory effects, but we do need to ensure that the reference
				// count decrement happens-after the CAS on the head.
				refs = prevHead->freeListRefs.fetch_sub(1, std::memory_order_acq_rel);
				if (refs == SHOULD_BE_ON_FREELIST + 1) {
					add_knowing_refcount_is_zero(prevHead);
				}
			}
			
			return nullptr;
		}